

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddTriangle(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImU32 col,float thickness)

{
  float thickness_local;
  ImU32 col_local;
  ImVec2 *c_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    PathLineTo(this,a);
    PathLineTo(this,b);
    PathLineTo(this,c);
    PathStroke(this,col,true,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddTriangle(const ImVec2& a, const ImVec2& b, const ImVec2& c, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathStroke(col, true, thickness);
}